

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aierror.cpp
# Opt level: O3

string * __thiscall
ai::formatErrno_abi_cxx11_(string *__return_storage_ptr__,ai *this,int error_code)

{
  string local_38;
  
  stringFromErrno_abi_cxx11_(&local_38,this,error_code);
  formatError(__return_storage_ptr__,(int)this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string formatErrno(const int error_code)
    {
        return ai::formatError(error_code, ai::stringFromErrno(error_code));
    }